

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollarea.cpp
# Opt level: O3

void __thiscall QScrollAreaPrivate::updateWidgetPosition(QScrollAreaPrivate *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  QWidgetData *pQVar3;
  long lVar4;
  QWidget *pQVar5;
  QWidgetData *pQVar6;
  LayoutDirection direction;
  int iVar7;
  int iVar8;
  QWidget *this_00;
  long in_FS_OFFSET;
  QRect QVar9;
  QRect QVar10;
  QRect local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  direction = QWidget::layoutDirection
                        (*(QWidget **)
                          &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                           super_QWidgetPrivate.field_0x8);
  pQVar3 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
  local_48.x2.m_i = (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i;
  local_48.y2.m_i = (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i;
  local_48.x1.m_i = 0;
  local_48.y1.m_i = 0;
  iVar7 = QAbstractSlider::value
                    (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
  iVar8 = QAbstractSlider::value
                    (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider);
  lVar4 = *(long *)((this->widget).wp.value + 0x20);
  local_58.y1.m_i = -iVar8;
  local_58.x1.m_i = -iVar7;
  uVar1 = *(undefined8 *)(lVar4 + 0x1c);
  uVar2 = *(undefined8 *)(lVar4 + 0x14);
  local_58.x2.m_i = (int)uVar1 - (iVar7 + (int)uVar2);
  local_58.y2.m_i = (int)((ulong)uVar1 >> 0x20) - (iVar8 + (int)((ulong)uVar2 >> 0x20));
  QVar9 = QStyle::visualRect(direction,&local_48,&local_58);
  lVar4 = *(long *)((this->widget).wp.value + 0x20);
  local_58.x1.m_i = (*(int *)(lVar4 + 0x1c) - *(int *)(lVar4 + 0x14)) + 1;
  local_58.y1.m_i = (*(int *)(lVar4 + 0x20) - *(int *)(lVar4 + 0x18)) + 1;
  pQVar3 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
  local_48.x2.m_i = (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i;
  local_48.y2.m_i = (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i;
  local_48.x1.m_i = 0;
  local_48.y1.m_i = 0;
  QVar10 = QStyle::alignedRect(direction,
                               (Alignment)
                               (this->alignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                               super_QFlagsStorage<Qt::AlignmentFlag>.i,(QSize *)&local_58,&local_48
                              );
  pQVar5 = (QWidget *)(this->widget).wp.value;
  this_00 = (QWidget *)0x0;
  if (*(int *)((this->widget).wp.d + 4) != 0) {
    this_00 = pQVar5;
  }
  pQVar3 = pQVar5->data;
  pQVar6 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
  local_48.x1.m_i = QVar9.x1.m_i.m_i;
  if (((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1 <
      ((pQVar6->crect).x2.m_i - (pQVar6->crect).x1.m_i) + 1) {
    local_48.x1.m_i = QVar10.x1.m_i.m_i;
  }
  local_48.y1.m_i = QVar9.y1.m_i.m_i;
  if (((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) + 1 <
      ((pQVar6->crect).y2.m_i - (pQVar6->crect).y1.m_i) + 1) {
    local_48.y1.m_i = QVar10.y1.m_i.m_i;
  }
  QWidget::move(this_00,(QPoint *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollAreaPrivate::updateWidgetPosition()
{
    Q_Q(QScrollArea);
    Qt::LayoutDirection dir = q->layoutDirection();
    QRect scrolled = QStyle::visualRect(dir, viewport->rect(), QRect(QPoint(-hbar->value(), -vbar->value()), widget->size()));
    QRect aligned = QStyle::alignedRect(dir, alignment, widget->size(), viewport->rect());
    widget->move(widget->width() < viewport->width() ? aligned.x() : scrolled.x(),
                 widget->height() < viewport->height() ? aligned.y() : scrolled.y());
}